

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::GeneratedCodeInfo_Annotation::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  _func_int **pp_Var2;
  Nullable<const_char_*> failure_msg;
  Arena *arena;
  GeneratedCodeInfo_Annotation *_this;
  GeneratedCodeInfo_Annotation *local_28;
  MessageLite *local_20 [2];
  
  local_28 = (GeneratedCodeInfo_Annotation *)to_msg;
  local_20[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::GeneratedCodeInfo_Annotation_const*,google::protobuf::GeneratedCodeInfo_Annotation*>
                          ((GeneratedCodeInfo_Annotation **)local_20,&local_28,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x3c46,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20)
    ;
  }
  RepeatedField<int>::MergeFrom
            (&(local_28->field_0)._impl_.path_,
             (RepeatedField<int> *)&from_msg[1]._internal_metadata_);
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      pp_Var2 = from_msg[3]._vptr_MessageLite;
      (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_28->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      arena = (Arena *)(local_28->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_28->field_0)._impl_.source_file_,
                 (string *)((ulong)pp_Var2 & 0xfffffffffffffffc),arena);
    }
    if ((uVar1 & 2) != 0) {
      *(int *)((long)&local_28->field_0 + 0x28) = (int)from_msg[3]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 4) != 0) {
      (local_28->field_0)._impl_.end_ =
           *(int32_t *)((long)&from_msg[3]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 8) != 0) {
      *(undefined4 *)((long)&local_28->field_0 + 0x30) =
           *(undefined4 *)&from_msg[4]._vptr_MessageLite;
    }
  }
  (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_28->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_28->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void GeneratedCodeInfo_Annotation::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<GeneratedCodeInfo_Annotation*>(&to_msg);
  auto& from = static_cast<const GeneratedCodeInfo_Annotation&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_path()->MergeFrom(from._internal_path());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_source_file(from._internal_source_file());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.begin_ = from._impl_.begin_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.end_ = from._impl_.end_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.semantic_ = from._impl_.semantic_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}